

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler>
::operator()(arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler> *this
            ,basic_string_view<char> value)

{
  ulong uVar1;
  uint uVar2;
  format_specs *specs;
  buffer<char> *pbVar3;
  size_t sVar4;
  ulong __n;
  char *data;
  str_writer<char> local_40;
  
  __n = value.size_;
  specs = this->specs_;
  if (specs == (format_specs *)0x0) {
    pbVar3 = (this->writer_).out_.container;
    sVar4 = pbVar3->size_;
    uVar1 = sVar4 + __n;
    if (pbVar3->capacity_ < uVar1) {
      (**pbVar3->_vptr_buffer)(pbVar3,uVar1);
    }
    pbVar3->size_ = uVar1;
    if (__n != 0) {
      memmove(pbVar3->ptr_ + sVar4,value.data_,__n);
    }
  }
  else {
    if ((specs->type != '\0') && (specs->type != 's')) {
      error_handler::on_error((error_handler *)&local_40,"invalid type specifier");
    }
    uVar2 = specs->precision;
    local_40.size_ = (ulong)uVar2;
    if (__n <= uVar2) {
      local_40.size_ = __n;
    }
    if ((int)uVar2 < 0) {
      local_40.size_ = __n;
    }
    local_40.s = value.data_;
    basic_writer<fmt::v6::buffer_range<char>>::
    write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::str_writer<char>>
              ((basic_writer<fmt::v6::buffer_range<char>> *)this,specs,&local_40);
  }
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }